

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

UDate icu_63::parseDateTimeString(UnicodeString *str,int32_t offset,UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  char16_t cVar3;
  int32_t year;
  int32_t iVar4;
  int32_t dom;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int32_t iVar8;
  double dVar9;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (str->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    if (((0xfffffffd < iVar8 - 0x11U) && (cVar3 = UnicodeString::doCharAt(str,8), cVar3 == L'T')) &&
       ((iVar8 != 0x10 || (cVar3 = UnicodeString::doCharAt(str,0xf), cVar3 == L'Z')))) {
      year = parseAsciiDigits(str,0,4,status);
      iVar4 = parseAsciiDigits(str,4,2,status);
      dom = parseAsciiDigits(str,6,2,status);
      uVar5 = parseAsciiDigits(str,9,2,status);
      uVar6 = parseAsciiDigits(str,0xb,2,status);
      uVar7 = parseAsciiDigits(str,0xd,2,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar2 = Grego::monthLength(year,iVar4 + -1);
        if (((((0 < dom) && (-1 < year)) && (0xfffffff3 < iVar4 - 0xdU)) &&
            ((uVar7 < 0x3c && (uVar6 < 0x3c)))) && ((uVar5 < 0x18 && (dom <= iVar2)))) {
          dVar9 = Grego::fieldsToDay(year,iVar4 + -1,dom);
          dVar9 = (double)(int)(uVar7 * 1000 + uVar6 * 60000 + uVar5 * 3600000) + dVar9 * 86400000.0
          ;
          if (iVar8 == 0x10) {
            return dVar9;
          }
          return dVar9 - (double)offset;
        }
      }
    }
    *status = U_INVALID_FORMAT_ERROR;
  }
  return 0.0;
}

Assistant:

static UDate parseDateTimeString(const UnicodeString& str, int32_t offset, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0.0;
    }

    int32_t year = 0, month = 0, day = 0, hour = 0, min = 0, sec = 0;
    UBool isUTC = FALSE;
    UBool isValid = FALSE;
    do {
        int length = str.length();
        if (length != 15 && length != 16) {
            // FORM#1 15 characters, such as "20060317T142115"
            // FORM#2 16 characters, such as "20060317T142115Z"
            break;
        }
        if (str.charAt(8) != 0x0054) {
            // charcter "T" must be used for separating date and time
            break;
        }
        if (length == 16) {
            if (str.charAt(15) != 0x005A) {
                // invalid format
                break;
            }
            isUTC = TRUE;
        }

        year = parseAsciiDigits(str, 0, 4, status);
        month = parseAsciiDigits(str, 4, 2, status) - 1;  // 0-based
        day = parseAsciiDigits(str, 6, 2, status);
        hour = parseAsciiDigits(str, 9, 2, status);
        min = parseAsciiDigits(str, 11, 2, status);
        sec = parseAsciiDigits(str, 13, 2, status);

        if (U_FAILURE(status)) {
            break;
        }

        // check valid range
        int32_t maxDayOfMonth = Grego::monthLength(year, month);
        if (year < 0 || month < 0 || month > 11 || day < 1 || day > maxDayOfMonth ||
                hour < 0 || hour >= 24 || min < 0 || min >= 60 || sec < 0 || sec >= 60) {
            break;
        }

        isValid = TRUE;
    } while(false);

    if (!isValid) {
        status = U_INVALID_FORMAT_ERROR;
        return 0.0;
    }
    // Calculate the time
    UDate time = Grego::fieldsToDay(year, month, day) * U_MILLIS_PER_DAY;
    time += (hour * U_MILLIS_PER_HOUR + min * U_MILLIS_PER_MINUTE + sec * U_MILLIS_PER_SECOND);
    if (!isUTC) {
        time -= offset;
    }
    return time;
}